

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O0

void tcu::astc::anon_unknown_0::encodeISE
               (BitAssignAccessStream *dst,ISEParams *params,ISEInput *input,int numValues)

{
  bool bVar1;
  deUint32 dVar2;
  ISEParams *pIVar3;
  undefined8 *puVar4;
  deUint32 local_c4;
  deUint32 *local_b0;
  int local_94;
  deUint32 *local_90;
  int local_74;
  int local_70;
  undefined8 uStack_6c;
  int i;
  undefined8 local_64;
  undefined8 local_5c;
  int local_54;
  int local_50;
  int numValuesInBlock_1;
  int blockNdx_1;
  int numBlocks_1;
  deUint32 local_40 [2];
  deUint32 local_38 [2];
  int local_30;
  int local_2c;
  int numValuesInBlock;
  int blockNdx;
  int numBlocks;
  int numValues_local;
  ISEInput *input_local;
  ISEParams *params_local;
  BitAssignAccessStream *dst_local;
  
  blockNdx = numValues;
  _numBlocks = input;
  input_local = (ISEInput *)params;
  params_local = (ISEParams *)dst;
  if (params->mode == ISEMODE_TRIT) {
    numValuesInBlock = deDivRoundUp32(numValues,5);
    for (local_2c = 0; pIVar3 = params_local, local_2c < numValuesInBlock; local_2c = local_2c + 1)
    {
      if (local_2c == numValuesInBlock + -1) {
        local_74 = blockNdx + (numValuesInBlock + -1) * -5;
      }
      else {
        local_74 = 5;
      }
      local_30 = local_74;
      dVar2 = (input_local->value).plain[0];
      bVar1 = _numBlocks->isGivenInBlockForm;
      if ((_numBlocks->isGivenInBlockForm & 1U) == 0) {
        memset(&blockNdx_1,0,0x18);
      }
      else {
        puVar4 = (undefined8 *)((long)&_numBlocks->value + (long)local_2c * 0x18);
        _blockNdx_1 = *puVar4;
        local_40 = (deUint32  [2])puVar4[1];
        local_38 = (deUint32  [2])puVar4[2];
      }
      if ((_numBlocks->isGivenInBlockForm & 1U) == 0) {
        local_90 = (deUint32 *)((long)&_numBlocks->value + (long)(local_2c * 5) * 4);
      }
      else {
        local_90 = (deUint32 *)0x0;
      }
      encodeISETritBlock((BitAssignAccessStream *)pIVar3,dVar2,(bool)(bVar1 & 1),
                         (Block *)&blockNdx_1,local_90,local_30);
    }
  }
  else if (params->mode == ISEMODE_QUINT) {
    numValuesInBlock_1 = deDivRoundUp32(numValues,3);
    for (local_50 = 0; pIVar3 = params_local, local_50 < numValuesInBlock_1; local_50 = local_50 + 1
        ) {
      if (local_50 == numValuesInBlock_1 + -1) {
        local_94 = blockNdx + (numValuesInBlock_1 + -1) * -3;
      }
      else {
        local_94 = 3;
      }
      local_54 = local_94;
      dVar2 = (input_local->value).plain[0];
      bVar1 = _numBlocks->isGivenInBlockForm;
      if ((_numBlocks->isGivenInBlockForm & 1U) == 0) {
        memset(&stack0xffffffffffffff94,0,0x18);
      }
      else {
        puVar4 = (undefined8 *)((long)&_numBlocks->value + (long)local_50 * 0x18);
        uStack_6c = *puVar4;
        local_64 = puVar4[1];
        local_5c = puVar4[2];
      }
      if ((_numBlocks->isGivenInBlockForm & 1U) == 0) {
        local_b0 = (deUint32 *)((long)&_numBlocks->value + (long)(local_50 * 3) * 4);
      }
      else {
        local_b0 = (deUint32 *)0x0;
      }
      encodeISEQuintBlock((BitAssignAccessStream *)pIVar3,dVar2,(bool)(bVar1 & 1),
                          (Block *)&stack0xffffffffffffff94,local_b0,local_54);
    }
  }
  else {
    for (local_70 = 0; local_70 < blockNdx; local_70 = local_70 + 1) {
      if ((_numBlocks->isGivenInBlockForm & 1U) == 0) {
        local_c4 = *(deUint32 *)((long)&_numBlocks->value + (long)local_70 * 4);
      }
      else {
        local_c4 = *(deUint32 *)((long)&_numBlocks->value + (long)local_70 * 0x18 + 4);
      }
      encodeISEBitBlock((BitAssignAccessStream *)params_local,(input_local->value).plain[0],local_c4
                       );
    }
  }
  return;
}

Assistant:

static void encodeISE (BitAssignAccessStream& dst, const ISEParams& params, const ISEInput& input, int numValues)
{
	if (params.mode == ISEMODE_TRIT)
	{
		const int numBlocks = deDivRoundUp32(numValues, 5);
		for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
		{
			const int numValuesInBlock = blockNdx == numBlocks-1 ? numValues - 5*(numBlocks-1) : 5;
			encodeISETritBlock(dst, params.numBits, input.isGivenInBlockForm,
							   input.isGivenInBlockForm ? input.value.block[blockNdx]	: ISEInput::Block(),
							   input.isGivenInBlockForm ? DE_NULL						: &input.value.plain[5*blockNdx],
							   numValuesInBlock);
		}
	}
	else if (params.mode == ISEMODE_QUINT)
	{
		const int numBlocks = deDivRoundUp32(numValues, 3);
		for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
		{
			const int numValuesInBlock = blockNdx == numBlocks-1 ? numValues - 3*(numBlocks-1) : 3;
			encodeISEQuintBlock(dst, params.numBits, input.isGivenInBlockForm,
								input.isGivenInBlockForm ? input.value.block[blockNdx]	: ISEInput::Block(),
								input.isGivenInBlockForm ? DE_NULL						: &input.value.plain[3*blockNdx],
								numValuesInBlock);
		}
	}
	else
	{
		DE_ASSERT(params.mode == ISEMODE_PLAIN_BIT);
		for (int i = 0; i < numValues; i++)
			encodeISEBitBlock(dst, params.numBits, input.isGivenInBlockForm ? input.value.block[i].bitValues[0] : input.value.plain[i]);
	}
}